

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_support.c
# Opt level: O0

int per_put_few_bits(asn_per_outp_t *po,uint32_t bits,int obits)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint in_EDX;
  uint in_ESI;
  long *in_RDI;
  int complete_bytes;
  uint8_t *buf;
  size_t omsk;
  size_t off;
  int local_4;
  
  if (((int)in_EDX < 1) || (0x1f < (int)in_EDX)) {
    local_4 = 0;
    if (in_EDX != 0) {
      local_4 = -1;
    }
  }
  else {
    ASN_DEBUG("[PER put %d bits %x to %p+%d bits]",(ulong)in_EDX,(ulong)in_ESI,*in_RDI,
              in_RDI[1] & 0xffffffff);
    if (7 < (ulong)in_RDI[1]) {
      *in_RDI = ((ulong)in_RDI[1] >> 3) + *in_RDI;
      in_RDI[2] = in_RDI[2] - (in_RDI[1] & 0xfffffffffffffff8U);
      in_RDI[1] = in_RDI[1] & 7;
    }
    if ((ulong)in_RDI[2] < (ulong)(in_RDI[1] + (long)(int)in_EDX)) {
      iVar4 = (int)*in_RDI - ((int)in_RDI + 0x18);
      ASN_DEBUG("[PER output %ld complete + %ld]",(long)iVar4,in_RDI[9]);
      iVar5 = (*(code *)in_RDI[7])(in_RDI + 3,(long)iVar4,in_RDI[8]);
      if (iVar5 < 0) {
        return -1;
      }
      if (in_RDI[1] != 0) {
        *(undefined1 *)(in_RDI + 3) = *(undefined1 *)*in_RDI;
      }
      *in_RDI = (long)(in_RDI + 3);
      in_RDI[2] = 0x100;
      in_RDI[9] = (long)iVar4 + in_RDI[9];
    }
    pbVar1 = (byte *)*in_RDI;
    uVar6 = (1 << (8U - (char)in_RDI[1] & 0x1f)) - 1U ^ 0xffffffff;
    uVar8 = in_RDI[1] + (long)(int)in_EDX;
    uVar7 = (1 << ((byte)in_EDX & 0x1f)) - 1U & in_ESI;
    ASN_DEBUG("[PER out %d %u/%x (t=%d,o=%d) %x&%x=%x]",(ulong)in_EDX,(ulong)uVar7,(ulong)uVar7,
              in_RDI[1] & 0xffffffff,uVar8 & 0xffffffff,(uint)*pbVar1,uVar6 & 0xff,*pbVar1 & uVar6);
    cVar2 = (char)uVar8;
    bVar3 = (byte)uVar6;
    if (uVar8 < 9) {
      in_RDI[1] = uVar8;
      uVar7 = uVar7 << (8U - cVar2 & 0x1f);
      *pbVar1 = *pbVar1 & bVar3 | (byte)uVar7;
    }
    else if (uVar8 < 0x11) {
      in_RDI[1] = uVar8;
      uVar7 = uVar7 << (0x10U - cVar2 & 0x1f);
      *pbVar1 = *pbVar1 & bVar3 | (byte)(uVar7 >> 8);
      pbVar1[1] = (byte)uVar7;
    }
    else if (uVar8 < 0x19) {
      in_RDI[1] = uVar8;
      uVar7 = uVar7 << (0x18U - cVar2 & 0x1f);
      *pbVar1 = *pbVar1 & bVar3 | (byte)(uVar7 >> 0x10);
      pbVar1[1] = (byte)(uVar7 >> 8);
      pbVar1[2] = (byte)uVar7;
    }
    else if (uVar8 < 0x20) {
      in_RDI[1] = uVar8;
      uVar7 = uVar7 << (0x20U - cVar2 & 0x1f);
      *pbVar1 = *pbVar1 & bVar3 | (byte)(uVar7 >> 0x18);
      pbVar1[1] = (byte)(uVar7 >> 0x10);
      pbVar1[2] = (byte)(uVar7 >> 8);
      pbVar1[3] = (byte)uVar7;
    }
    else {
      per_put_few_bits((asn_per_outp_t *)CONCAT44(uVar7,in_EDX),(uint32_t)(uVar8 >> 0x20),(int)uVar8
                      );
      per_put_few_bits((asn_per_outp_t *)CONCAT44(uVar7,in_EDX),(uint32_t)(uVar8 >> 0x20),(int)uVar8
                      );
    }
    ASN_DEBUG("[PER out %u/%x => %02x buf+%ld]",(ulong)uVar7,(ulong)uVar7,(ulong)*pbVar1,
              *in_RDI - (long)(in_RDI + 3));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
per_put_few_bits(asn_per_outp_t *po, uint32_t bits, int obits) {
	size_t off;	/* Next after last bit offset */
	size_t omsk;	/* Existing last byte meaningful bits mask */
	uint8_t *buf;

	if(obits <= 0 || obits >= 32) return obits ? -1 : 0;

	ASN_DEBUG("[PER put %d bits %x to %p+%d bits]",
			obits, (int)bits, po->buffer, (int)po->nboff);

	/*
	 * Normalize position indicator.
	 */
	if(po->nboff >= 8) {
		po->buffer += (po->nboff >> 3);
		po->nbits  -= (po->nboff & ~0x07);
		po->nboff  &= 0x07;
	}

	/*
	 * Flush whole-bytes output, if necessary.
	 */
	if(po->nboff + obits > po->nbits) {
		int complete_bytes = (po->buffer - po->tmpspace);
		ASN_DEBUG("[PER output %ld complete + %ld]",
			(long)complete_bytes, (long)po->flushed_bytes);
		if(po->outper(po->tmpspace, complete_bytes, po->op_key) < 0)
			return -1;
		if(po->nboff)
			po->tmpspace[0] = po->buffer[0];
		po->buffer = po->tmpspace;
		po->nbits = 8 * sizeof(po->tmpspace);
		po->flushed_bytes += complete_bytes;
	}

	/*
	 * Now, due to sizeof(tmpspace), we are guaranteed large enough space.
	 */
	buf = po->buffer;
	omsk = ~((1 << (8 - po->nboff)) - 1);
	off = (po->nboff + obits);

	/* Clear data of debris before meaningful bits */
	bits &= (((uint32_t)1 << obits) - 1);

	ASN_DEBUG("[PER out %d %u/%x (t=%d,o=%d) %x&%x=%x]", obits,
		(int)bits, (int)bits,
		(int)po->nboff, (int)off,
		buf[0], (int)(omsk&0xff),
		(int)(buf[0] & omsk));

	if(off <= 8)	/* Completely within 1 byte */
		po->nboff = off,
		bits <<= (8 - off),
		buf[0] = (buf[0] & omsk) | bits;
	else if(off <= 16)
		po->nboff = off,
		bits <<= (16 - off),
		buf[0] = (buf[0] & omsk) | (bits >> 8),
		buf[1] = bits;
	else if(off <= 24)
		po->nboff = off,
		bits <<= (24 - off),
		buf[0] = (buf[0] & omsk) | (bits >> 16),
		buf[1] = bits >> 8,
		buf[2] = bits;
	else if(off <= 31)
		po->nboff = off,
		bits <<= (32 - off),
		buf[0] = (buf[0] & omsk) | (bits >> 24),
		buf[1] = bits >> 16,
		buf[2] = bits >> 8,
		buf[3] = bits;
	else {
		per_put_few_bits(po, bits >> (obits - 24), 24);
		per_put_few_bits(po, bits, obits - 24);
	}

	ASN_DEBUG("[PER out %u/%x => %02x buf+%ld]",
		(int)bits, (int)bits, buf[0],
		(long)(po->buffer - po->tmpspace));

	return 0;
}